

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O1

optional<tinyusdz::Token> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,PrimVar *this)

{
  undefined8 *puVar1;
  vtable_type *pvVar2;
  uint32_t uVar3;
  bool bVar4;
  optional<tinyusdz::Token> local_40;
  
  pvVar2 = (this->_value).v_.vtable;
  if (pvVar2 == (vtable_type *)0x0) {
    bVar4 = false;
  }
  else {
    uVar3 = (*pvVar2->type_id)();
    bVar4 = uVar3 == 4;
  }
  if ((((bVar4) || ((this->_blocked & 1U) != 0)) ||
      ((pvVar2 = (this->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
       (uVar3 = (*pvVar2->type_id)(), uVar3 == 0)))) ||
     ((pvVar2 = (this->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
      (uVar3 = (*pvVar2->type_id)(), uVar3 == 1)))) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
  }
  else {
    tinyusdz::value::Value::get_value<tinyusdz::Token>(&local_40,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_40.has_value_;
    if (local_40.has_value_ == true) {
      puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
      *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
      if (local_40.contained.data.__align ==
          (anon_struct_8_0_00000001_for___align)((long)&local_40.contained + 0x10)) {
        *puVar1 = CONCAT71(local_40.contained._17_7_,local_40.contained._16_1_);
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_40.contained._24_8_
        ;
      }
      else {
        *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
             local_40.contained.data.__align;
        *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
             CONCAT71(local_40.contained._17_7_,local_40.contained._16_1_);
      }
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_40.contained._8_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }